

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_gcc.cc
# Opt level: O0

void YUY2ToYRow_AVX2(uint8_t *src_yuy2,uint8_t *dst_y,int width)

{
  undefined1 (*pauVar1) [32];
  undefined1 auVar2 [32];
  bool bVar3;
  undefined1 auVar4 [32];
  int iVar5;
  undefined1 auVar6 [32];
  undefined1 in_ZMM5 [64];
  int width_local;
  uint8_t *dst_y_local;
  uint8_t *src_yuy2_local;
  
  auVar6 = vpcmpeqb_avx2(in_ZMM5._0_32_,in_ZMM5._0_32_);
  auVar6 = vpsrlw_avx2(auVar6,8);
  do {
    auVar2 = *(undefined1 (*) [32])src_yuy2;
    pauVar1 = (undefined1 (*) [32])((long)src_yuy2 + 0x20);
    src_yuy2 = (uint8_t *)((long)src_yuy2 + 0x40);
    auVar2 = vpand_avx2(auVar2,auVar6);
    auVar4 = vpand_avx2(*pauVar1,auVar6);
    auVar2 = vpackuswb_avx2(auVar2,auVar4);
    auVar2 = vpermq_avx2(auVar2,0xd8);
    *(undefined1 (*) [32])dst_y = auVar2;
    dst_y = (uint8_t *)((long)dst_y + 0x20);
    iVar5 = width + -0x20;
    bVar3 = 0x1f < width;
    width = iVar5;
  } while (iVar5 != 0 && bVar3);
  return;
}

Assistant:

void YUY2ToYRow_AVX2(const uint8_t* src_yuy2, uint8_t* dst_y, int width) {
  asm volatile(
      "vpcmpeqb    %%ymm5,%%ymm5,%%ymm5          \n"
      "vpsrlw      $0x8,%%ymm5,%%ymm5            \n"

      LABELALIGN
      "1:                                        \n"
      "vmovdqu     (%0),%%ymm0                   \n"
      "vmovdqu     0x20(%0),%%ymm1               \n"
      "lea         0x40(%0),%0                   \n"
      "vpand       %%ymm5,%%ymm0,%%ymm0          \n"
      "vpand       %%ymm5,%%ymm1,%%ymm1          \n"
      "vpackuswb   %%ymm1,%%ymm0,%%ymm0          \n"
      "vpermq      $0xd8,%%ymm0,%%ymm0           \n"
      "vmovdqu     %%ymm0,(%1)                   \n"
      "lea         0x20(%1),%1                   \n"
      "sub         $0x20,%2                      \n"
      "jg          1b                            \n"
      "vzeroupper                                \n"
      : "+r"(src_yuy2),  // %0
        "+r"(dst_y),     // %1
        "+r"(width)      // %2
      :
      : "memory", "cc", "xmm0", "xmm1", "xmm5");
}